

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_decimal.cpp
# Opt level: O0

bool __thiscall
icu_63::numparse::impl::DecimalMatcher::match
          (DecimalMatcher *this,StringSegment *segment,ParsedNumber *result,int8_t exponentSign,
          UErrorCode *param_4)

{
  byte bVar1;
  bool bVar2;
  UBool UVar3;
  bool bVar4;
  int32_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  int64_t iVar8;
  __off_t __length;
  char *__file;
  byte local_2f1;
  bool local_2d3;
  bool local_295;
  bool local_279;
  bool local_25d;
  bool local_249;
  int iStack_208;
  int32_t exponentInt;
  int64_t exponentLong;
  int iStack_1f8;
  bool overflow;
  bool local_1f4;
  bool local_1f3;
  int32_t digitsToRemove;
  bool currValidPrimary;
  bool prevValidSecondary;
  bool currValidPrimary_1;
  bool prevValidSecondary_1;
  UnicodeString local_1b0;
  int32_t local_16c;
  int32_t local_168;
  int32_t overlap_3;
  int32_t overlap_2;
  int32_t overlap_1;
  bool isGrouping;
  bool isDecimal;
  UnicodeString *pUStack_158;
  int32_t overlap;
  UnicodeString *str;
  uint local_148;
  int32_t i;
  UChar32 cp;
  int32_t iStack_13c;
  int8_t digit;
  int32_t prevGroupCount;
  int32_t prevGroupSepType;
  int32_t prevGroupOffset;
  int32_t currGroupCount;
  int32_t currGroupSepType;
  int32_t currGroupOffset;
  UnicodeString actualDecimalString;
  undefined1 local_d8 [8];
  UnicodeString actualGroupingString;
  undefined1 local_90 [4];
  int32_t digitsAfterDecimalPlace;
  DecimalQuantity digitsConsumed;
  bool maybeMore;
  int32_t initialOffset;
  UErrorCode *param_4_local;
  int8_t exponentSign_local;
  ParsedNumber *result_local;
  StringSegment *segment_local;
  DecimalMatcher *this_local;
  
  bVar2 = ParsedNumber::seenNumber(result);
  if ((bVar2) && (exponentSign == '\0')) {
    this_local._7_1_ = false;
  }
  else {
    digitsConsumed._76_4_ = StringSegment::getOffset(segment);
    digitsConsumed._75_1_ = 0;
    icu_63::number::impl::DecimalQuantity::DecimalQuantity((DecimalQuantity *)local_90);
    digitsConsumed.super_IFixedDecimal._vptr_IFixedDecimal._0_1_ = 1;
    actualGroupingString.fUnion._52_4_ = 0;
    UnicodeString::UnicodeString((UnicodeString *)local_d8);
    UnicodeString::UnicodeString((UnicodeString *)&currGroupSepType);
    UnicodeString::setToBogus((UnicodeString *)local_d8);
    UnicodeString::setToBogus((UnicodeString *)&currGroupSepType);
    currGroupCount = 0;
    prevGroupOffset = 0;
    prevGroupSepType = 0;
    prevGroupCount = -1;
    iStack_13c = -1;
    cp = -1;
    while (iVar5 = StringSegment::length(segment), 0 < iVar5) {
      digitsConsumed._75_1_ = 0;
      i._3_1_ = -1;
      local_148 = StringSegment::getCodePoint(segment);
      UVar3 = u_isdigit_63(local_148);
      if (UVar3 != '\0') {
        StringSegment::adjustOffset(segment,2 - (uint)(local_148 < 0x10000));
        iVar5 = u_digit_63(local_148,'\n');
        i._3_1_ = (char)iVar5;
      }
      if ((i._3_1_ == -1) &&
         (UVar3 = LocalPointerBase<const_icu_63::UnicodeString>::isNull
                            (&(this->fLocalDigitStrings).
                              super_LocalPointerBase<const_icu_63::UnicodeString>), UVar3 == '\0'))
      {
        for (str._4_4_ = 0; str._4_4_ < 10; str._4_4_ = str._4_4_ + 1) {
          pUStack_158 = LocalArray<const_icu_63::UnicodeString>::operator[]
                                  (&this->fLocalDigitStrings,(long)str._4_4_);
          UVar3 = UnicodeString::isEmpty(pUStack_158);
          if (UVar3 == '\0') {
            iVar6 = StringSegment::getCommonPrefixLength(segment,pUStack_158);
            overlap_1 = iVar6;
            iVar7 = UnicodeString::length(pUStack_158);
            iVar5 = overlap_1;
            if (iVar6 == iVar7) {
              StringSegment::adjustOffset(segment,overlap_1);
              i._3_1_ = (char)str._4_4_;
              break;
            }
            local_249 = true;
            if ((digitsConsumed._75_1_ & 1) == 0) {
              iVar6 = StringSegment::length(segment);
              local_249 = iVar5 == iVar6;
            }
            digitsConsumed._75_1_ = local_249;
          }
        }
      }
      if (i._3_1_ < '\0') {
        overlap_2._3_1_ = 0;
        overlap_2._2_1_ = 0;
        UVar3 = UnicodeString::isBogus((UnicodeString *)&currGroupSepType);
        if ((UVar3 != '\0') &&
           (UVar3 = UnicodeString::isEmpty(&this->decimalSeparator), UVar3 == '\0')) {
          iVar5 = StringSegment::getCommonPrefixLength(segment,&this->decimalSeparator);
          local_25d = true;
          overlap_3 = iVar5;
          if ((digitsConsumed._75_1_ & 1) == 0) {
            iVar6 = StringSegment::length(segment);
            local_25d = iVar5 == iVar6;
          }
          iVar5 = overlap_3;
          digitsConsumed._75_1_ = local_25d;
          iVar6 = UnicodeString::length(&this->decimalSeparator);
          if (iVar5 == iVar6) {
            overlap_2._3_1_ = 1;
            UnicodeString::operator=((UnicodeString *)&currGroupSepType,&this->decimalSeparator);
          }
        }
        UVar3 = UnicodeString::isBogus((UnicodeString *)local_d8);
        if (UVar3 == '\0') {
          iVar5 = StringSegment::getCommonPrefixLength(segment,(UnicodeString *)local_d8);
          local_279 = true;
          local_168 = iVar5;
          if ((digitsConsumed._75_1_ & 1) == 0) {
            iVar6 = StringSegment::length(segment);
            local_279 = iVar5 == iVar6;
          }
          iVar5 = local_168;
          digitsConsumed._75_1_ = local_279;
          iVar6 = UnicodeString::length((UnicodeString *)local_d8);
          if (iVar5 == iVar6) {
            overlap_2._2_1_ = 1;
          }
        }
        if (((((this->groupingDisabled & 1U) == 0) &&
             (UVar3 = UnicodeString::isBogus((UnicodeString *)local_d8), UVar3 != '\0')) &&
            (UVar3 = UnicodeString::isBogus((UnicodeString *)&currGroupSepType), UVar3 != '\0')) &&
           (UVar3 = UnicodeString::isEmpty(&this->groupingSeparator), UVar3 == '\0')) {
          iVar5 = StringSegment::getCommonPrefixLength(segment,&this->groupingSeparator);
          local_295 = true;
          local_16c = iVar5;
          if ((digitsConsumed._75_1_ & 1) == 0) {
            iVar6 = StringSegment::length(segment);
            local_295 = iVar5 == iVar6;
          }
          iVar5 = local_16c;
          digitsConsumed._75_1_ = local_295;
          iVar6 = UnicodeString::length(&this->groupingSeparator);
          if (iVar5 == iVar6) {
            overlap_2._2_1_ = 1;
            UnicodeString::operator=((UnicodeString *)local_d8,&this->groupingSeparator);
          }
        }
        if ((((overlap_2._2_1_ & 1) == 0) &&
            (UVar3 = UnicodeString::isBogus((UnicodeString *)&currGroupSepType), UVar3 != '\0')) &&
           (UVar3 = UnicodeSet::contains(this->decimalUniSet,local_148), UVar3 != '\0')) {
          overlap_2._3_1_ = 1;
          UnicodeString::UnicodeString(&local_1b0,local_148);
          UnicodeString::operator=((UnicodeString *)&currGroupSepType,&local_1b0);
          UnicodeString::~UnicodeString(&local_1b0);
        }
        if ((((this->groupingDisabled & 1U) == 0) &&
            (UVar3 = UnicodeString::isBogus((UnicodeString *)local_d8), UVar3 != '\0')) &&
           ((UVar3 = UnicodeString::isBogus((UnicodeString *)&currGroupSepType), UVar3 != '\0' &&
            (UVar3 = UnicodeSet::contains(this->groupingUniSet,local_148), UVar3 != '\0')))) {
          overlap_2._2_1_ = 1;
          UnicodeString::UnicodeString((UnicodeString *)&digitsToRemove,local_148);
          UnicodeString::operator=((UnicodeString *)local_d8,(UnicodeString *)&digitsToRemove);
          UnicodeString::~UnicodeString((UnicodeString *)&digitsToRemove);
        }
        if ((((overlap_2._3_1_ & 1) == 0) && ((overlap_2._2_1_ & 1) == 0)) ||
           ((((overlap_2._3_1_ & 1) != 0 && ((this->integerOnly & 1U) != 0)) ||
            ((prevGroupOffset == 2 && ((overlap_2._2_1_ & 1) != 0)))))) break;
        bVar2 = validateGroup(this,iStack_13c,cp,false);
        bVar4 = validateGroup(this,prevGroupOffset,prevGroupSepType,true);
        if ((!bVar2) || (((overlap_2._3_1_ & 1) != 0 && (!bVar4)))) {
          if ((((overlap_2._2_1_ & 1) == 0) || (prevGroupSepType != 0)) &&
             ((this->requireGroupingMatch & 1U) != 0)) {
            icu_63::number::impl::DecimalQuantity::clear((DecimalQuantity *)local_90);
            digitsConsumed.super_IFixedDecimal._vptr_IFixedDecimal._0_1_ = 1;
          }
          break;
        }
        if ((((this->requireGroupingMatch & 1U) != 0) && (prevGroupSepType == 0)) &&
           (prevGroupOffset == 1)) break;
        prevGroupCount = currGroupCount;
        cp = prevGroupSepType;
        if ((overlap_2._3_1_ & 1) == 0) {
          iStack_13c = prevGroupOffset;
        }
        else {
          iStack_13c = -1;
        }
        if (prevGroupSepType != 0) {
          currGroupCount = StringSegment::getOffset(segment);
        }
        prevGroupOffset = 2;
        if ((overlap_2._2_1_ & 1) != 0) {
          prevGroupOffset = 1;
        }
        prevGroupSepType = 0;
        if ((overlap_2._2_1_ & 1) == 0) {
          iVar5 = UnicodeString::length((UnicodeString *)&currGroupSepType);
          StringSegment::adjustOffset(segment,iVar5);
        }
        else {
          iVar5 = UnicodeString::length((UnicodeString *)local_d8);
          StringSegment::adjustOffset(segment,iVar5);
        }
      }
      else {
        if (((byte)digitsConsumed.super_IFixedDecimal._vptr_IFixedDecimal & 1) != 0) {
          digitsConsumed.super_IFixedDecimal._vptr_IFixedDecimal._0_1_ = 0;
          icu_63::number::impl::DecimalQuantity::clear((DecimalQuantity *)local_90);
        }
        icu_63::number::impl::DecimalQuantity::appendDigit
                  ((DecimalQuantity *)local_90,i._3_1_,0,true);
        prevGroupSepType = prevGroupSepType + 1;
        UVar3 = UnicodeString::isBogus((UnicodeString *)&currGroupSepType);
        if (UVar3 == '\0') {
          actualGroupingString.fUnion._52_4_ = actualGroupingString.fUnion._52_4_ + 1;
        }
      }
    }
    if ((prevGroupOffset != 2) && (prevGroupSepType == 0)) {
      digitsConsumed._75_1_ = 1;
      StringSegment::setOffset(segment,currGroupCount);
      currGroupCount = prevGroupCount;
      prevGroupOffset = iStack_13c;
      prevGroupSepType = cp;
      prevGroupCount = -1;
      iStack_13c = 0;
      cp = 1;
    }
    local_1f3 = validateGroup(this,iStack_13c,cp,false);
    local_1f4 = validateGroup(this,prevGroupOffset,prevGroupSepType,true);
    if ((this->requireGroupingMatch & 1U) == 0) {
      iStack_1f8 = 0;
      if (local_1f3) {
        if ((!local_1f4) && ((iStack_13c != 0 || (cp != 0)))) {
          digitsConsumed._75_1_ = 1;
          StringSegment::setOffset(segment,currGroupCount);
          iStack_1f8 = prevGroupSepType;
        }
      }
      else {
        StringSegment::setOffset(segment,prevGroupCount);
        iStack_1f8 = prevGroupSepType + cp;
      }
      if (iStack_1f8 != 0) {
        __file = (char *)(ulong)(uint)-iStack_1f8;
        icu_63::number::impl::DecimalQuantity::adjustMagnitude
                  ((DecimalQuantity *)local_90,-iStack_1f8);
        icu_63::number::impl::DecimalQuantity::truncate((DecimalQuantity *)local_90,__file,__length)
        ;
      }
      local_1f3 = true;
      local_1f4 = true;
    }
    if ((prevGroupOffset != 2) && ((local_1f3 == false || (local_1f4 == false)))) {
      digitsConsumed.super_IFixedDecimal._vptr_IFixedDecimal._0_1_ = 1;
    }
    if (((byte)digitsConsumed.super_IFixedDecimal._vptr_IFixedDecimal & 1) == 0) {
      icu_63::number::impl::DecimalQuantity::adjustMagnitude
                ((DecimalQuantity *)local_90,-actualGroupingString.fUnion._52_4_);
      if ((exponentSign == '\0') ||
         (iVar5 = StringSegment::getOffset(segment), iVar5 == digitsConsumed._76_4_)) {
        icu_63::number::impl::DecimalQuantity::operator=
                  (&result->quantity,(DecimalQuantity *)local_90);
      }
      else {
        bVar2 = icu_63::number::impl::DecimalQuantity::fitsInLong((DecimalQuantity *)local_90,false)
        ;
        if (bVar2) {
          iVar8 = icu_63::number::impl::DecimalQuantity::toLong((DecimalQuantity *)local_90,false);
          if (iVar8 < 0x80000000) {
            iStack_208 = (int)iVar8;
            exponentLong._3_1_ =
                 icu_63::number::impl::DecimalQuantity::adjustMagnitude
                           (&result->quantity,exponentSign * iStack_208);
          }
          else {
            exponentLong._3_1_ = true;
          }
        }
        else {
          exponentLong._3_1_ = true;
        }
        if (exponentLong._3_1_ != false) {
          if (exponentSign == -1) {
            icu_63::number::impl::DecimalQuantity::clear(&result->quantity);
          }
          else {
            (result->quantity).bogus = true;
            result->flags = result->flags | 0x80;
          }
        }
      }
      UVar3 = UnicodeString::isBogus((UnicodeString *)&currGroupSepType);
      if (UVar3 == '\0') {
        result->flags = result->flags | 0x20;
      }
      ParsedNumber::setCharsConsumed(result,segment);
      iVar5 = StringSegment::length(segment);
      local_2f1 = 1;
      bVar1 = local_2f1;
      if (iVar5 != 0) {
        bVar1 = digitsConsumed._75_1_;
      }
    }
    else {
      local_2d3 = true;
      if ((digitsConsumed._75_1_ & 1) == 0) {
        iVar5 = StringSegment::length(segment);
        local_2d3 = iVar5 == 0;
      }
      digitsConsumed._75_1_ = local_2d3;
      StringSegment::setOffset(segment,digitsConsumed._76_4_);
      bVar1 = digitsConsumed._75_1_;
    }
    this_local._7_1_ = (bool)(bVar1 & 1);
    UnicodeString::~UnicodeString((UnicodeString *)&currGroupSepType);
    UnicodeString::~UnicodeString((UnicodeString *)local_d8);
    icu_63::number::impl::DecimalQuantity::~DecimalQuantity((DecimalQuantity *)local_90);
  }
  return this_local._7_1_;
}

Assistant:

bool DecimalMatcher::match(StringSegment& segment, ParsedNumber& result, int8_t exponentSign,
                           UErrorCode&) const {
    if (result.seenNumber() && exponentSign == 0) {
        // A number has already been consumed.
        return false;
    } else if (exponentSign != 0) {
        // scientific notation always comes after the number
        U_ASSERT(!result.quantity.bogus);
    }

    // Initial offset before any character consumption.
    int32_t initialOffset = segment.getOffset();

    // Return value: whether to ask for more characters.
    bool maybeMore = false;

    // All digits consumed so far.
    number::impl::DecimalQuantity digitsConsumed;
    digitsConsumed.bogus = true;

    // The total number of digits after the decimal place, used for scaling the result.
    int32_t digitsAfterDecimalPlace = 0;

    // The actual grouping and decimal separators used in the string.
    // If non-null, we have seen that token.
    UnicodeString actualGroupingString;
    UnicodeString actualDecimalString;
    actualGroupingString.setToBogus();
    actualDecimalString.setToBogus();

    // Information for two groups: the previous group and the current group.
    //
    // Each group has three pieces of information:
    //
    // Offset: the string position of the beginning of the group, including a leading separator
    // if there was a leading separator. This is needed in case we need to rewind the parse to
    // that position.
    //
    // Separator type:
    // 0 => beginning of string
    // 1 => lead separator is a grouping separator
    // 2 => lead separator is a decimal separator
    //
    // Count: the number of digits in the group. If -1, the group has been validated.
    int32_t currGroupOffset = 0;
    int32_t currGroupSepType = 0;
    int32_t currGroupCount = 0;
    int32_t prevGroupOffset = -1;
    int32_t prevGroupSepType = -1;
    int32_t prevGroupCount = -1;

    while (segment.length() > 0) {
        maybeMore = false;

        // Attempt to match a digit.
        int8_t digit = -1;

        // Try by code point digit value.
        UChar32 cp = segment.getCodePoint();
        if (u_isdigit(cp)) {
            segment.adjustOffset(U16_LENGTH(cp));
            digit = static_cast<int8_t>(u_digit(cp, 10));
        }

        // Try by digit string.
        if (digit == -1 && !fLocalDigitStrings.isNull()) {
            for (int32_t i = 0; i < 10; i++) {
                const UnicodeString& str = fLocalDigitStrings[i];
                if (str.isEmpty()) {
                    continue;
                }
                int32_t overlap = segment.getCommonPrefixLength(str);
                if (overlap == str.length()) {
                    segment.adjustOffset(overlap);
                    digit = static_cast<int8_t>(i);
                    break;
                }
                maybeMore = maybeMore || (overlap == segment.length());
            }
        }

        if (digit >= 0) {
            // Digit was found.
            if (digitsConsumed.bogus) {
                digitsConsumed.bogus = false;
                digitsConsumed.clear();
            }
            digitsConsumed.appendDigit(digit, 0, true);
            currGroupCount++;
            if (!actualDecimalString.isBogus()) {
                digitsAfterDecimalPlace++;
            }
            continue;
        }

        // Attempt to match a literal grouping or decimal separator.
        bool isDecimal = false;
        bool isGrouping = false;

        // 1) Attempt the decimal separator string literal.
        // if (we have not seen a decimal separator yet) { ... }
        if (actualDecimalString.isBogus() && !decimalSeparator.isEmpty()) {
            int32_t overlap = segment.getCommonPrefixLength(decimalSeparator);
            maybeMore = maybeMore || (overlap == segment.length());
            if (overlap == decimalSeparator.length()) {
                isDecimal = true;
                actualDecimalString = decimalSeparator;
            }
        }

        // 2) Attempt to match the actual grouping string literal.
        if (!actualGroupingString.isBogus()) {
            int32_t overlap = segment.getCommonPrefixLength(actualGroupingString);
            maybeMore = maybeMore || (overlap == segment.length());
            if (overlap == actualGroupingString.length()) {
                isGrouping = true;
            }
        }

        // 2.5) Attempt to match a new the grouping separator string literal.
        // if (we have not seen a grouping or decimal separator yet) { ... }
        if (!groupingDisabled && actualGroupingString.isBogus() && actualDecimalString.isBogus() &&
            !groupingSeparator.isEmpty()) {
            int32_t overlap = segment.getCommonPrefixLength(groupingSeparator);
            maybeMore = maybeMore || (overlap == segment.length());
            if (overlap == groupingSeparator.length()) {
                isGrouping = true;
                actualGroupingString = groupingSeparator;
            }
        }

        // 3) Attempt to match a decimal separator from the equivalence set.
        // if (we have not seen a decimal separator yet) { ... }
        // The !isGrouping is to confirm that we haven't yet matched the current character.
        if (!isGrouping && actualDecimalString.isBogus()) {
            if (decimalUniSet->contains(cp)) {
                isDecimal = true;
                actualDecimalString = UnicodeString(cp);
            }
        }

        // 4) Attempt to match a grouping separator from the equivalence set.
        // if (we have not seen a grouping or decimal separator yet) { ... }
        if (!groupingDisabled && actualGroupingString.isBogus() && actualDecimalString.isBogus()) {
            if (groupingUniSet->contains(cp)) {
                isGrouping = true;
                actualGroupingString = UnicodeString(cp);
            }
        }

        // Leave if we failed to match this as a separator.
        if (!isDecimal && !isGrouping) {
            break;
        }

        // Check for conditions when we don't want to accept the separator.
        if (isDecimal && integerOnly) {
            break;
        } else if (currGroupSepType == 2 && isGrouping) {
            // Fraction grouping
            break;
        }

        // Validate intermediate grouping sizes.
        bool prevValidSecondary = validateGroup(prevGroupSepType, prevGroupCount, false);
        bool currValidPrimary = validateGroup(currGroupSepType, currGroupCount, true);
        if (!prevValidSecondary || (isDecimal && !currValidPrimary)) {
            // Invalid grouping sizes.
            if (isGrouping && currGroupCount == 0) {
                // Trailing grouping separators: these are taken care of below
                U_ASSERT(currGroupSepType == 1);
            } else if (requireGroupingMatch) {
                // Strict mode: reject the parse
                digitsConsumed.clear();
                digitsConsumed.bogus = true;
            }
            break;
        } else if (requireGroupingMatch && currGroupCount == 0 && currGroupSepType == 1) {
            break;
        } else {
            // Grouping sizes OK so far.
            prevGroupOffset = currGroupOffset;
            prevGroupCount = currGroupCount;
            if (isDecimal) {
                // Do not validate this group any more.
                prevGroupSepType = -1;
            } else {
                prevGroupSepType = currGroupSepType;
            }
        }

        // OK to accept the separator.
        // Special case: don't update currGroup if it is empty; this allows two grouping
        // separators in a row in lenient mode.
        if (currGroupCount != 0) {
            currGroupOffset = segment.getOffset();
        }
        currGroupSepType = isGrouping ? 1 : 2;
        currGroupCount = 0;
        if (isGrouping) {
            segment.adjustOffset(actualGroupingString.length());
        } else {
            segment.adjustOffset(actualDecimalString.length());
        }
    }

    // End of main loop.
    // Back up if there was a trailing grouping separator.
    // Shift prev -> curr so we can check it as a final group.
    if (currGroupSepType != 2 && currGroupCount == 0) {
        maybeMore = true;
        segment.setOffset(currGroupOffset);
        currGroupOffset = prevGroupOffset;
        currGroupSepType = prevGroupSepType;
        currGroupCount = prevGroupCount;
        prevGroupOffset = -1;
        prevGroupSepType = 0;
        prevGroupCount = 1;
    }

    // Validate final grouping sizes.
    bool prevValidSecondary = validateGroup(prevGroupSepType, prevGroupCount, false);
    bool currValidPrimary = validateGroup(currGroupSepType, currGroupCount, true);
    if (!requireGroupingMatch) {
        // The cases we need to handle here are lone digits.
        // Examples: "1,1"  "1,1,"  "1,1,1"  "1,1,1,"  ",1" (all parse as 1)
        // See more examples in numberformattestspecification.txt
        int32_t digitsToRemove = 0;
        if (!prevValidSecondary) {
            segment.setOffset(prevGroupOffset);
            digitsToRemove += prevGroupCount;
            digitsToRemove += currGroupCount;
        } else if (!currValidPrimary && (prevGroupSepType != 0 || prevGroupCount != 0)) {
            maybeMore = true;
            segment.setOffset(currGroupOffset);
            digitsToRemove += currGroupCount;
        }
        if (digitsToRemove != 0) {
            digitsConsumed.adjustMagnitude(-digitsToRemove);
            digitsConsumed.truncate();
        }
        prevValidSecondary = true;
        currValidPrimary = true;
    }
    if (currGroupSepType != 2 && (!prevValidSecondary || !currValidPrimary)) {
        // Grouping failure.
        digitsConsumed.bogus = true;
    }

    // Strings that start with a separator but have no digits,
    // or strings that failed a grouping size check.
    if (digitsConsumed.bogus) {
        maybeMore = maybeMore || (segment.length() == 0);
        segment.setOffset(initialOffset);
        return maybeMore;
    }

    // We passed all inspections. Start post-processing.

    // Adjust for fraction part.
    digitsConsumed.adjustMagnitude(-digitsAfterDecimalPlace);

    // Set the digits, either normal or exponent.
    if (exponentSign != 0 && segment.getOffset() != initialOffset) {
        bool overflow = false;
        if (digitsConsumed.fitsInLong()) {
            int64_t exponentLong = digitsConsumed.toLong(false);
            U_ASSERT(exponentLong >= 0);
            if (exponentLong <= INT32_MAX) {
                auto exponentInt = static_cast<int32_t>(exponentLong);
                if (result.quantity.adjustMagnitude(exponentSign * exponentInt)) {
                    overflow = true;
                }
            } else {
                overflow = true;
            }
        } else {
            overflow = true;
        }
        if (overflow) {
            if (exponentSign == -1) {
                // Set to zero
                result.quantity.clear();
            } else {
                // Set to infinity
                result.quantity.bogus = true;
                result.flags |= FLAG_INFINITY;
            }
        }
    } else {
        result.quantity = digitsConsumed;
    }

    // Set other information into the result and return.
    if (!actualDecimalString.isBogus()) {
        result.flags |= FLAG_HAS_DECIMAL_SEPARATOR;
    }
    result.setCharsConsumed(segment);
    return segment.length() == 0 || maybeMore;
}